

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedStringFieldGenerator::RepeatedStringFieldGenerator
          (RepeatedStringFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  Options *options_local;
  FieldDescriptor *descriptor_local;
  RepeatedStringFieldGenerator *this_local;
  
  FieldGenerator::FieldGenerator(&this->super_FieldGenerator);
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__RepeatedStringFieldGenerator_0040f668;
  this->descriptor_ = descriptor;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->variables_);
  anon_unknown_3::SetStringVariables(descriptor,&this->variables_,options);
  return;
}

Assistant:

RepeatedStringFieldGenerator::
RepeatedStringFieldGenerator(const FieldDescriptor* descriptor,
                             const Options& options)
  : descriptor_(descriptor) {
  SetStringVariables(descriptor, &variables_, options);
}